

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

bool __thiscall
lzham::vector<lzham::node>::try_resize_no_construct
          (vector<lzham::node> *this,uint new_size,bool grow_hint)

{
  bool bVar1;
  undefined1 in_DL;
  uint in_ESI;
  vector<lzham::node> *in_RDI;
  undefined3 in_stack_ffffffffffffffdc;
  uint min_new_capacity;
  
  if (in_RDI->m_capacity < in_ESI) {
    min_new_capacity = CONCAT13(1,in_stack_ffffffffffffffdc);
    if (in_ESI != in_RDI->m_size + 1) {
      min_new_capacity = CONCAT13(in_DL,in_stack_ffffffffffffffdc) & 0x1ffffff;
    }
    bVar1 = increase_capacity(in_RDI,min_new_capacity,SUB41(in_ESI >> 0x18,0),
                              SUB41(in_ESI >> 0x10,0));
    if (!bVar1) {
      return false;
    }
  }
  in_RDI->m_size = in_ESI;
  return true;
}

Assistant:

inline bool try_resize_no_construct(uint new_size, bool grow_hint = false)
      {
         if (new_size > m_capacity)
         {
            if (!increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint, true))
               return false;
         }
         
         m_size = new_size;

         return true;
      }